

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O3

SQBool sqstd_rex_searchrange
                 (SQRex *exp,SQChar *text_begin,SQChar *text_end,SQChar **out_begin,SQChar **out_end
                 )

{
  SQChar *pSVar1;
  SQChar *str;
  SQBool SVar2;
  long lVar3;
  SQChar *pSVar4;
  SQRexNode *pSVar5;
  
  if (text_begin < text_end) {
    lVar3 = exp->_first;
    exp->_bol = text_begin;
    exp->_eol = text_end;
    do {
      pSVar4 = text_begin;
      if (lVar3 == -1) {
        lVar3 = -1;
        pSVar1 = pSVar4;
      }
      else {
        pSVar5 = exp->_nodes;
        str = pSVar4;
        while( true ) {
          exp->_currsubexp = 0;
          str = sqstd_rex_matchnode(exp,pSVar5 + lVar3,str,(SQRexNode *)0x0);
          pSVar1 = (SQChar *)0x0;
          if (str == (SQChar *)0x0) break;
          pSVar5 = exp->_nodes;
          lVar3 = pSVar5[lVar3].next;
          if (lVar3 == -1) goto LAB_00137152;
        }
      }
      str = pSVar1;
    } while ((str == (SQChar *)0x0) && (text_begin = pSVar4 + 1, pSVar4 + 1 != text_end));
    if (str == (SQChar *)0x0) {
      SVar2 = 0;
    }
    else {
LAB_00137152:
      if (out_begin != (SQChar **)0x0) {
        *out_begin = pSVar4;
      }
      SVar2 = 1;
      if (out_end != (SQChar **)0x0) {
        *out_end = str;
      }
    }
  }
  else {
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SQBool sqstd_rex_searchrange(SQRex* exp,const SQChar* text_begin,const SQChar* text_end,const SQChar** out_begin, const SQChar** out_end)
{
    const SQChar *cur = NULL;
    SQInteger node = exp->_first;
    if(text_begin >= text_end) return SQFalse;
    exp->_bol = text_begin;
    exp->_eol = text_end;
    do {
        cur = text_begin;
        while(node != -1) {
            exp->_currsubexp = 0;
            cur = sqstd_rex_matchnode(exp,&exp->_nodes[node],cur,NULL);
            if(!cur)
                break;
            node = exp->_nodes[node].next;
        }
        text_begin++;
    } while(cur == NULL && text_begin != text_end);

    if(cur == NULL)
        return SQFalse;

    --text_begin;

    if(out_begin) *out_begin = text_begin;
    if(out_end) *out_end = cur;
    return SQTrue;
}